

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int target_set_dynamic(TARGET_HANDLE target,_Bool dynamic_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE dynamic_amqp_value;
  TARGET_INSTANCE *target_instance;
  int result;
  _Bool dynamic_value_local;
  TARGET_HANDLE target_local;
  
  if (target == (TARGET_HANDLE)0x0) {
    target_instance._0_4_ = 0x377a;
  }
  else {
    item_value = amqpvalue_create_boolean(dynamic_value);
    if (item_value == (AMQP_VALUE)0x0) {
      target_instance._0_4_ = 0x3782;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(target->composite_value,4,item_value);
      if (iVar1 == 0) {
        target_instance._0_4_ = 0;
      }
      else {
        target_instance._0_4_ = 0x3788;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)target_instance;
}

Assistant:

int target_set_dynamic(TARGET_HANDLE target, bool dynamic_value)
{
    int result;

    if (target == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target;
        AMQP_VALUE dynamic_amqp_value = amqpvalue_create_boolean(dynamic_value);
        if (dynamic_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(target_instance->composite_value, 4, dynamic_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(dynamic_amqp_value);
        }
    }

    return result;
}